

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O3

void Cec2_CollectSuper_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  size_t __size;
  int iVar1;
  Gia_Obj_t *pGVar2;
  uint *puVar3;
  void **ppvVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  Gia_Obj_t *local_38;
  
  if (((ulong)pObj & 1) == 0) {
    bVar8 = fFirst == 0;
    local_38 = pObj;
    do {
      while( true ) {
        uVar7 = *(ulong *)pObj;
        uVar6 = (uint)uVar7;
        if ((~uVar6 & 0x9fffffff) == 0) goto LAB_0064f194;
        if (bVar8) {
          if (p->pRefs == (int *)0x0) {
            puVar3 = &pObj->Value;
          }
          else {
            pGVar2 = p->pObjs;
            if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            puVar3 = (uint *)(p->pRefs +
                             (int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555);
          }
          if (1 < (int)*puVar3) goto LAB_0064f194;
        }
        if (fUseMuxes == 0) break;
        if ((uVar6 >> 0x1e & 1) != 0) goto LAB_0064f194;
        Cec2_CollectSuper_rec
                  (p,(Gia_Obj_t *)
                     ((ulong)(uVar6 >> 0x1d & 1) | (ulong)(pObj + -(uVar7 & 0x1fffffff))),vSuper,0,
                   fUseMuxes);
        pGVar2 = pObj + -(*(ulong *)pObj >> 0x20 & 0x1fffffff);
        uVar7 = (ulong)((uint)(*(ulong *)pObj >> 0x3d) & 1);
        pObj = (Gia_Obj_t *)(uVar7 | (ulong)pGVar2);
        bVar8 = true;
        if (uVar7 != 0 || ((ulong)pGVar2 & 1) != 0) goto LAB_0064f194;
      }
      fUseMuxes = 0;
      Cec2_CollectSuper_rec
                (p,(Gia_Obj_t *)
                   ((ulong)(uVar6 >> 0x1d & 1) | (ulong)(local_38 + -(uVar7 & 0x1fffffff))),vSuper,0
                 ,0);
      pGVar2 = local_38 + -(*(ulong *)local_38 >> 0x20 & 0x1fffffff);
      uVar7 = (ulong)((uint)(*(ulong *)local_38 >> 0x3d) & 1);
      pObj = (Gia_Obj_t *)(uVar7 | (ulong)pGVar2);
      bVar8 = true;
      local_38 = pObj;
    } while (uVar7 == 0 && ((ulong)pGVar2 & 1) == 0);
  }
LAB_0064f194:
  iVar1 = vSuper->nSize;
  if (0 < (long)iVar1) {
    lVar5 = 0;
    do {
      if ((Gia_Obj_t *)vSuper->pArray[lVar5] == pObj) {
        return;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  if (iVar1 == vSuper->nCap) {
    if (iVar1 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar4;
      vSuper->nCap = 0x10;
    }
    else {
      __size = (ulong)(uint)(iVar1 * 2) * 8;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(__size);
      }
      else {
        ppvVar4 = (void **)realloc(vSuper->pArray,__size);
      }
      vSuper->pArray = ppvVar4;
      vSuper->nCap = iVar1 * 2;
    }
  }
  else {
    ppvVar4 = vSuper->pArray;
  }
  iVar1 = vSuper->nSize;
  vSuper->nSize = iVar1 + 1;
  ppvVar4[iVar1] = pObj;
  return;
}

Assistant:

void Cec2_CollectSuper_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) || 
         (!fFirst && (p->pRefs ? Gia_ObjRefNum(p, pObj) : Gia_ObjValue(pObj)) > 1) || 
         (fUseMuxes && pObj->fMark0) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Cec2_CollectSuper_rec( p, Gia_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Cec2_CollectSuper_rec( p, Gia_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}